

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forms_compatability.cxx
# Opt level: O2

void fl_show_form(Fl_Window *f,int place,int b,char *n)

{
  uint *puVar1;
  byte *pbVar2;
  int iVar3;
  int iVar4;
  int scr_h;
  int scr_w;
  int scr_y;
  int scr_x;
  
  Fl_Window::label(f,n);
  if (b == 0) {
    puVar1 = &(f->super_Fl_Group).super_Fl_Widget.flags_;
    *(byte *)puVar1 = (byte)*puVar1 | 8;
  }
  if ((b == 2) || (fl_modal_next != '\0')) {
    pbVar2 = (byte *)((long)&(f->super_Fl_Group).super_Fl_Widget.flags_ + 1);
    *pbVar2 = *pbVar2 | 0x40;
    fl_modal_next = '\0';
  }
  if ((place & 1U) != 0) {
    Fl_Window::hotspot(f,(Fl_Widget *)f,0);
  }
  if ((place & 2U) != 0) {
    Fl::screen_xywh(&scr_x,&scr_y,&scr_w,&scr_h);
    Fl_Widget::position((Fl_Widget *)f,(scr_w - (f->super_Fl_Group).super_Fl_Widget.w_) / 2 + scr_x,
                        (scr_h - (f->super_Fl_Group).super_Fl_Widget.h_) / 2 + scr_y);
  }
  if ((place & 0x40U) != 0) {
    Fl_Window::fullscreen(f);
  }
  if ((place & 0x14U) != 0) {
    iVar3 = (f->super_Fl_Group).super_Fl_Widget.x_;
    if (iVar3 < 0) {
      iVar3 = Fl::w();
      iVar3 = ~(f->super_Fl_Group).super_Fl_Widget.w_ + iVar3 +
              (f->super_Fl_Group).super_Fl_Widget.x_;
    }
    iVar4 = (f->super_Fl_Group).super_Fl_Widget.y_;
    if (iVar4 < 0) {
      iVar4 = Fl::h();
      iVar4 = ~(f->super_Fl_Group).super_Fl_Widget.h_ + iVar4 +
              (f->super_Fl_Group).super_Fl_Widget.y_;
    }
    Fl_Widget::position((Fl_Widget *)f,iVar3,iVar4);
  }
  if ((place & 0xfffffff7U) == 0) {
    puVar1 = &(f->super_Fl_Group).super_Fl_Widget.flags_;
    *(byte *)puVar1 = (byte)*puVar1 & 0xef;
    if (place != 0) goto LAB_00206f2d;
  }
  else if (((uint)place >> 0xe & 1) == 0) goto LAB_00206f2d;
  if ((f->super_Fl_Group).resizable_ == (Fl_Widget *)0x0) {
    (f->super_Fl_Group).resizable_ = (Fl_Widget *)f;
  }
LAB_00206f2d:
  if (initargc == 0) {
    (*(f->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[5])(f);
  }
  else {
    Fl_Window::show(f,initargc,initargv);
    initargc = 0;
  }
  return;
}

Assistant:

void fl_show_form(Fl_Window *f,int place,int b,const char *n) {

  f->label(n);
  if (!b) f->clear_border();
  if (fl_modal_next || b==FL_TRANSIENT) {f->set_modal(); fl_modal_next = 0;}

  if (place & FL_PLACE_MOUSE) f->hotspot(f);

  if (place & FL_PLACE_CENTER) {
    int scr_x, scr_y, scr_w, scr_h;
    Fl::screen_xywh(scr_x, scr_y, scr_w, scr_h);
    f->position(scr_x+(scr_w-f->w())/2, scr_y+(scr_h-f->h())/2);
  }

  if (place & FL_PLACE_FULLSCREEN)
    f->fullscreen();

  if (place & (FL_PLACE_POSITION | FL_PLACE_GEOMETRY))
    f->position(
      (f->x() < 0) ? Fl::w()-f->w()+f->x()-1 : f->x(),
      (f->y() < 0) ? Fl::h()-f->h()+f->y()-1 : f->y());

// if (place & FL_PLACE_ASPECT) {
// this is not yet implemented
// it can be done by setting size_range().

  if (place == FL_PLACE_FREE || place == FL_PLACE_SIZE)
    f->free_position();

  if (place == FL_PLACE_FREE || place & FL_FREE_SIZE)
    if (!f->resizable()) f->resizable(f);

  if (initargc) {f->show(initargc,initargv); initargc = 0;}
  else f->show();
}